

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall HecrSequential_constructRhs_Test::TestBody(HecrSequential_constructRhs_Test *this)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int size;
  AssertionResult gtest_ar;
  vec prev_layer;
  vec rhs;
  vec expected_rhs;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  AssertHelper local_f8;
  int local_ec;
  internal local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  vec local_d8;
  vec local_b8;
  void *local_a0;
  long local_98;
  long local_90;
  double local_88 [16];
  
  local_ec = 0xf;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x78);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0xf;
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar2) = 0xc000000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x78);
  local_88[0] = -629.4555753109618;
  local_88[1] = 19.0;
  local_88[2] = 19.0;
  local_88[3] = 19.0;
  local_88[4] = 19.0;
  local_88[5] = 19.0;
  local_88[6] = 19.0;
  local_88[7] = 19.0;
  local_88[8] = -629.4555753109618;
  local_88[9] = 0.0;
  local_88[10] = 0.0;
  local_88[0xb] = 0.0;
  local_88[0xc] = 0.0;
  local_88[0xd] = 0.0;
  local_88[0xe] = 0.0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_a0,local_88,local_88 + local_ec,
             (allocator_type *)&local_b8);
  construct_rhs(&local_b8,10,10,&local_d8,0.5,f_test,u_test);
  local_100.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_e8,"size","rhs.size()",&local_ec,(unsigned_long *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x55,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_100.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_100.ptr_ + 8))();
      }
      local_100.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_98 - (long)local_a0 == 0) {
    local_100.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    uVar3 = 0;
    pbVar5 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      local_100.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ABS(*(double *)((long)local_a0 + uVar3 * 8) -
               local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3]);
      if ((double)local_100.ptr_ <= (double)pbVar5) {
        local_100.ptr_ = pbVar5;
      }
      uVar3 = uVar3 + 1;
      pbVar5 = local_100.ptr_;
    } while ((uVar3 & 0xffffffff) < (ulong)(local_98 - (long)local_a0 >> 3));
  }
  testing::internal::CmpHelperLT<double,double>
            (local_e8,"max_diff(expected_rhs, rhs)","EPS",(double *)&local_100,&EPS);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x56,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_100.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_100.ptr_ + 8))();
      }
      local_100.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0 != (void *)0x0) {
    operator_delete(local_a0,local_90 - (long)local_a0);
  }
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HecrSequential, constructRhs)
{
    int nx = 10;
    int nt = 10;
    int size = 15;
    vec prev_layer(size, -2.0);
    double t = 0.5;
    double end = -629.4555753109617372408285645;
    double mid = 19.0;
    const double expected_rhs_values[] =
        { end, mid, mid, mid, mid, mid, mid, mid, end, 0, 0, 0, 0, 0, 0 };
    vec expected_rhs = make_vector(size, expected_rhs_values);

    vec rhs = construct_rhs(nx, nt, prev_layer, t, f_test, u_test);

    EXPECT_EQ(size, rhs.size());
    EXPECT_LT(max_diff(expected_rhs, rhs), EPS);
}